

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

float __thiscall ImGuiMenuColumns::DeclColumns(ImGuiMenuColumns *this,float w0,float w1,float w2)

{
  float fVar1;
  int i;
  long lVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  
  this->NextWidth = 0.0;
  fVar1 = this->Spacing;
  uVar3 = -(uint)(w0 <= this->NextWidths[0]);
  this->NextWidths[0] = (float)(~uVar3 & (uint)w0 | (uint)this->NextWidths[0] & uVar3);
  uVar3 = -(uint)(w1 <= this->NextWidths[1]);
  this->NextWidths[1] = (float)(~uVar3 & (uint)w1 | (uint)this->NextWidths[1] & uVar3);
  uVar3 = -(uint)(w2 <= this->NextWidths[2]);
  this->NextWidths[2] = (float)(~uVar3 & (uint)w2 | (uint)this->NextWidths[2] & uVar3);
  fVar4 = 0.0;
  lVar2 = 0;
  do {
    fVar5 = 0.0;
    if (lVar2 != 0) {
      fVar5 = (float)(-(uint)(0.0 < this->NextWidths[lVar2]) & (uint)fVar1);
    }
    fVar4 = fVar4 + this->NextWidths[lVar2] + fVar5;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  this->NextWidth = fVar4;
  uVar3 = -(uint)(fVar4 <= this->Width);
  return (float)(~uVar3 & (uint)fVar4 | (uint)this->Width & uVar3);
}

Assistant:

float ImGuiMenuColumns::DeclColumns(float w0, float w1, float w2) // not using va_arg because they promote float to double
{
    NextWidth = 0.0f;
    NextWidths[0] = ImMax(NextWidths[0], w0);
    NextWidths[1] = ImMax(NextWidths[1], w1);
    NextWidths[2] = ImMax(NextWidths[2], w2);
    for (int i = 0; i < 3; i++)
        NextWidth += NextWidths[i] + ((i > 0 && NextWidths[i] > 0.0f) ? Spacing : 0.0f);
    return ImMax(Width, NextWidth);
}